

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrnet.c
# Opt level: O1

int NET_RecvRaw(int sock,void *buffer,int length)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  
  if (sock < 0) {
    uVar6 = 0xffffffff;
  }
  else if (length < 1) {
    uVar6 = 0;
  }
  else {
    uVar5 = 0;
    do {
      sVar2 = recv(sock,(void *)((ulong)uVar5 + (long)buffer),(long)(int)(length - uVar5),0);
      uVar4 = (uint)sVar2;
      if (uVar4 == 0xffffffff) {
        piVar3 = __errno_location();
        iVar1 = *piVar3;
        while (iVar1 == 4) {
          *piVar3 = 0;
          sVar2 = recv(sock,(void *)((ulong)uVar5 + (long)buffer),(long)(int)(length - uVar5),0);
          uVar4 = (uint)sVar2;
          if (uVar4 != 0xffffffff) break;
          iVar1 = *piVar3;
        }
      }
      uVar6 = uVar4;
    } while (((-1 < (int)uVar4) && (uVar6 = uVar5, uVar4 != 0)) &&
            (uVar5 = uVar4 + uVar5, uVar6 = uVar5, (int)uVar5 < length));
  }
  return uVar6;
}

Assistant:

static int NET_RecvRaw(int sock, void *buffer, int length)
{
  /* Receive exactly length bytes into buffer. Returns number of bytes */
  /* received. Returns -1 in case of error. */


   int nrecv, n;
   char *buf = (char *)buffer;

   if (sock < 0) return -1;
   for (n = 0; n < length; n += nrecv) {
      while ((nrecv = recv(sock, buf+n, length-n, 0)) == -1 && errno == EINTR)
	errno = 0;     /* probably a SIGCLD that was caught */
      if (nrecv < 0)
         return nrecv;
      else if (nrecv == 0)
	break;        /*/ EOF */
   }

   return n;
}